

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::load_entries<setup::type_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::type_entry,_std::allocator<setup::type_entry>_> *result,enum_type entry_type
          )

{
  TypesafeBoolean p_Var1;
  ulong in_RCX;
  type_entry *in_RDI;
  vector<setup::type_entry,_std::allocator<setup::type_entry>_> *in_R8;
  type_entry entry;
  size_t i_1;
  size_t i;
  flags<setup::info::entry_types_Enum_,_21UL> *in_stack_fffffffffffffed8;
  size_type in_stack_fffffffffffffee8;
  vector<setup::type_entry,_std::allocator<setup::type_entry>_> *in_stack_fffffffffffffef0;
  info *in_stack_ffffffffffffff80;
  istream *in_stack_ffffffffffffff88;
  type_entry *in_stack_ffffffffffffff90;
  undefined8 local_48;
  undefined8 local_40;
  
  std::vector<setup::type_entry,_std::allocator<setup::type_entry>_>::clear
            ((vector<setup::type_entry,_std::allocator<setup::type_entry>_> *)0x17a091);
  flags<setup::info::entry_types_Enum_,_21UL>::operator&
            (in_stack_fffffffffffffed8,(enum_type)((ulong)in_RDI >> 0x20));
  p_Var1 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x17a0ba);
  if (p_Var1 == (TypesafeBoolean)0x0) {
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      type_entry::type_entry(in_RDI);
      type_entry::load(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                      );
      type_entry::~type_entry(in_RDI);
    }
  }
  else {
    std::vector<setup::type_entry,_std::allocator<setup::type_entry>_>::resize
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      std::vector<setup::type_entry,_std::allocator<setup::type_entry>_>::operator[](in_R8,local_40)
      ;
      type_entry::load(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80
                      );
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}